

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QPolygon * __thiscall
QGraphicsView::mapFromScene(QPolygon *__return_storage_ptr__,QGraphicsView *this,QRectF *rect)

{
  QTransform *pQVar1;
  QGraphicsViewPrivate *this_00;
  bool bVar2;
  uint uVar3;
  QPoint *b;
  QPoint *pQVar4;
  pointer pQVar5;
  QPoint QVar6;
  QPoint QVar7;
  QPoint QVar8;
  qint64 qVar9;
  QPoint QVar10;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  QArrayData *d;
  double local_c8;
  double local_b8;
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  QArrayData *local_48;
  qreal qStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  uVar3 = *(uint *)&this_00->field_0x300;
  if ((uVar3 & 0x10) == 0) {
    pQVar1 = &this_00->matrix;
    local_48 = (QArrayData *)rect->xp;
    qStack_40 = rect->yp;
    auVar14 = QTransform::map((QPointF *)pQVar1);
    qStack_40 = rect->yp;
    local_48 = (QArrayData *)(rect->xp + rect->w);
    auVar15 = QTransform::map((QPointF *)pQVar1);
    local_48 = (QArrayData *)(rect->w + rect->xp);
    qStack_40 = rect->h + rect->yp;
    auVar16 = QTransform::map((QPointF *)pQVar1);
    local_48 = (QArrayData *)rect->xp;
    qStack_40 = rect->yp + rect->h;
    auVar17 = QTransform::map((QPointF *)pQVar1);
    uVar3 = *(uint *)&this_00->field_0x300;
  }
  else {
    auVar14._0_8_ = rect->xp;
    auVar14._8_8_ = rect->yp;
    dVar12 = rect->w + rect->xp;
    auVar15._8_8_ = rect->yp;
    auVar15._0_8_ = dVar12;
    dVar11 = rect->h + rect->yp;
    auVar17._8_8_ = dVar11;
    auVar17._0_8_ = rect->xp;
    auVar16._8_8_ = dVar11;
    auVar16._0_8_ = dVar12;
  }
  local_58 = auVar17._8_8_;
  local_68 = auVar17._0_8_;
  local_78 = auVar16._8_8_;
  local_88 = auVar16._0_8_;
  local_98 = auVar15._8_8_;
  local_a8 = auVar15._0_8_;
  local_b8 = auVar14._8_8_;
  local_c8 = auVar14._0_8_;
  if ((uVar3 & 0x20) == 0) {
    qVar9 = this_00->scrollX;
  }
  else {
    QGraphicsViewPrivate::updateScroll(this_00);
    qVar9 = this_00->scrollX;
    if ((this_00->field_0x300 & 0x20) != 0) {
      QGraphicsViewPrivate::updateScroll(this_00);
    }
  }
  dVar11 = (double)qVar9;
  dVar13 = (double)this_00->scrollY;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (QPoint *)QArrayData::allocate(&local_48,8,0x10,4,KeepSize);
  (__return_storage_ptr__->super_QList<QPoint>).d.d = (Data *)local_48;
  (__return_storage_ptr__->super_QList<QPoint>).d.ptr = pQVar4;
  pQVar4[2].xp = 0;
  pQVar4[2].yp = 0;
  pQVar4[3].xp = 0;
  pQVar4[3].yp = 0;
  pQVar4->xp = 0;
  pQVar4->yp = 0;
  pQVar4[1].xp = 0;
  pQVar4[1].yp = 0;
  dVar12 = (double)((ulong)(local_c8 - dVar11) & 0x8000000000000000 | 0x3fe0000000000000) +
           (local_c8 - dVar11);
  bVar2 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  QVar6.xp.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar12);
  (__return_storage_ptr__->super_QList<QPoint>).d.size = 4;
  dVar12 = (double)((ulong)(local_b8 - dVar13) & 0x8000000000000000 | 0x3fe0000000000000) +
           (local_b8 - dVar13);
  bVar2 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  QVar6.yp.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar12);
  pQVar5 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  dVar12 = (double)((ulong)(local_a8 - dVar11) & 0x8000000000000000 | 0x3fe0000000000000) +
           (local_a8 - dVar11);
  bVar2 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  QVar10.xp.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar12)
  ;
  *pQVar5 = QVar6;
  dVar12 = (double)((ulong)(local_98 - dVar13) & 0x8000000000000000 | 0x3fe0000000000000) +
           (local_98 - dVar13);
  bVar2 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  QVar10.yp.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar12)
  ;
  pQVar5 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  dVar12 = (double)((ulong)(local_88 - dVar11) & 0x8000000000000000 | 0x3fe0000000000000) +
           (local_88 - dVar11);
  bVar2 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  QVar7.xp.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar12);
  pQVar5[1] = QVar10;
  dVar12 = (double)((ulong)(local_78 - dVar13) & 0x8000000000000000 | 0x3fe0000000000000) +
           (local_78 - dVar13);
  bVar2 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  QVar7.yp.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar12);
  pQVar5 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  pQVar5[2] = QVar7;
  dVar11 = (double)((ulong)(local_68 - dVar11) & 0x8000000000000000 | 0x3fe0000000000000) +
           (local_68 - dVar11);
  bVar2 = 2147483647.0 < dVar11;
  if (dVar11 <= -2147483648.0) {
    dVar11 = -2147483648.0;
  }
  QVar8.xp.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar11);
  dVar11 = (double)((ulong)(local_58 - dVar13) & 0x8000000000000000 | 0x3fe0000000000000) +
           (local_58 - dVar13);
  bVar2 = 2147483647.0 < dVar11;
  if (dVar11 <= -2147483648.0) {
    dVar11 = -2147483648.0;
  }
  QVar8.yp.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar11);
  pQVar5 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  pQVar5[3] = QVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygon QGraphicsView::mapFromScene(const QRectF &rect) const
{
    Q_D(const QGraphicsView);
    QPointF tl;
    QPointF tr;
    QPointF br;
    QPointF bl;
    if (!d->identityMatrix) {
        const QTransform &x = d->matrix;
        tl = x.map(rect.topLeft());
        tr = x.map(rect.topRight());
        br = x.map(rect.bottomRight());
        bl = x.map(rect.bottomLeft());
    } else {
        tl = rect.topLeft();
        tr = rect.topRight();
        br = rect.bottomRight();
        bl = rect.bottomLeft();
    }
    QPointF scrollOffset(d->horizontalScroll(), d->verticalScroll());
    tl -= scrollOffset;
    tr -= scrollOffset;
    br -= scrollOffset;
    bl -= scrollOffset;

    QPolygon poly(4);
    poly[0] = tl.toPoint();
    poly[1] = tr.toPoint();
    poly[2] = br.toPoint();
    poly[3] = bl.toPoint();
    return poly;
}